

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O2

void aom_highbd_quantize_b_32x32_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined1 auVar10 [12];
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  short sVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  int local_1078 [4];
  int local_1068;
  int iStack_1064;
  int iStack_1060;
  int iStack_105c;
  __m128i zbins [2];
  int idx_arr [1024];
  
  auVar22 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar20 = ZEXT416(*(uint *)zbin_ptr) & _DAT_0046ea00;
  sVar21 = auVar20._2_2_ + auVar22._2_2_;
  auVar10._4_8_ =
       (long)(((unkuint10)
               (uint6)(((unkuint10)CONCAT22(auVar22._6_2_,auVar22._6_2_) << 0x30) >> 0x20) << 0x20)
             >> 0x10);
  auVar10._2_2_ = sVar21;
  auVar10._0_2_ = sVar21;
  zbins[0][0]._0_4_ = (int)(short)(auVar20._0_2_ + auVar22._0_2_);
  zbins[0][0]._4_4_ = auVar10._0_4_ >> 0x10;
  local_1078[0] = -(int)zbins[0][0];
  local_1078[1] = -zbins[0][0]._4_4_;
  local_1078[2] = -zbins[0][0]._4_4_;
  local_1078[3] = -zbins[0][0]._4_4_;
  local_1068 = -zbins[0][0]._4_4_;
  iStack_1064 = -zbins[0][0]._4_4_;
  iStack_1060 = -zbins[0][0]._4_4_;
  iStack_105c = -zbins[0][0]._4_4_;
  lVar14 = 0;
  zbins[0][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[0][1]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][0]._4_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._0_4_ = zbins[0][0]._4_4_;
  zbins[1][1]._4_4_ = zbins[0][0]._4_4_;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  lVar17 = n_coeffs / 4;
  if (n_coeffs / 4 < 1) {
    lVar17 = lVar14;
  }
  uVar12 = 0;
  for (; lVar17 * 4 != lVar14; lVar14 = lVar14 + 4) {
    piVar1 = coeff_ptr + lVar14;
    uVar13 = (ulong)(lVar14 != 0);
    auVar22._0_4_ = -(uint)(*piVar1 < (int)zbins[uVar13][0]);
    auVar22._4_4_ = -(uint)(piVar1[1] < *(int *)((long)zbins[uVar13] + 4));
    auVar22._8_4_ = -(uint)(piVar1[2] < (int)zbins[uVar13][1]);
    auVar22._12_4_ = -(uint)(piVar1[3] < *(int *)((long)zbins[uVar13] + 0xc));
    auVar20._0_4_ = -(uint)(local_1078[uVar13 * 4] < *piVar1);
    auVar20._4_4_ = -(uint)(local_1078[uVar13 * 4 + 1] < piVar1[1]);
    auVar20._8_4_ = -(uint)(local_1078[uVar13 * 4 + 2] < piVar1[2]);
    auVar20._12_4_ = -(uint)(local_1078[uVar13 * 4 + 3] < piVar1[3]);
    auVar20 = auVar20 & auVar22;
    uVar2 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3;
    uVar3 = (ushort)(SUB161(auVar20 >> 0x27,0) & 1);
    uVar4 = (ushort)(SUB161(auVar20 >> 0x2f,0) & 1);
    uVar5 = (ushort)(SUB161(auVar20 >> 0x37,0) & 1);
    uVar6 = (ushort)(SUB161(auVar20 >> 0x3f,0) & 1);
    uVar7 = (ushort)(SUB161(auVar20 >> 0x4f,0) & 1);
    uVar8 = (ushort)(SUB161(auVar20 >> 0x57,0) & 1);
    uVar9 = (ushort)(SUB161(auVar20 >> 0x5f,0) & 1);
    iVar19 = (int)lVar14;
    if (uVar2 == 0) {
      lVar15 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      idx_arr[lVar15] = iVar19;
    }
    if (((uVar3 == 0 && uVar4 == 0) && uVar5 == 0) && uVar6 == 0) {
      lVar15 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      idx_arr[lVar15] = iVar19 + 1;
    }
    if ((((auVar20 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && uVar7 == 0) &&
        uVar8 == 0) && uVar9 == 0) {
      lVar15 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      idx_arr[lVar15] = iVar19 + 2;
    }
    if ((ushort)(uVar2 | uVar3 << 4 | uVar4 << 5 | uVar5 << 6 | uVar6 << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 | uVar7 << 9 | uVar8 << 10 |
                 uVar9 << 0xb | (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) < 0x1000) {
      lVar15 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      idx_arr[lVar15] = iVar19 + 3;
    }
  }
  uVar16 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar16;
  }
  sVar21 = -1;
  for (; uVar13 != uVar16; uVar16 = uVar16 + 1) {
    lVar17 = (long)idx_arr[uVar16];
    uVar12 = coeff_ptr[lVar17] >> 0x1f;
    uVar11 = (ulong)((uint)(lVar17 != 0) * 2);
    lVar14 = (long)(int)((*(short *)((long)round_ptr + uVar11) + 1 >> 1) +
                        ((coeff_ptr[lVar17] ^ uVar12) - uVar12));
    uVar18 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar11) *
                    (((ulong)(*(short *)((long)quant_ptr + uVar11) * lVar14) >> 0x10) + lVar14) >>
                   0xf);
    iVar19 = (uVar12 ^ uVar18) - uVar12;
    qcoeff_ptr[lVar17] = iVar19;
    dqcoeff_ptr[lVar17] = (*(short *)((long)dequant_ptr + uVar11) * iVar19) / 2;
    if (uVar18 != 0) {
      if (sVar21 <= iscan[lVar17]) {
        sVar21 = iscan[lVar17];
      }
    }
  }
  *eob_ptr = sVar21 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  __m128i zbins[2];
  __m128i nzbins[2];
  int idx = 0;
  int idx_arr[1024];
  int i, eob = -1;
  const int zbin0_tmp = ROUND_POWER_OF_TWO(zbin_ptr[0], 1);
  const int zbin1_tmp = ROUND_POWER_OF_TWO(zbin_ptr[1], 1);
  (void)scan;
  zbins[0] = _mm_set_epi32(zbin1_tmp, zbin1_tmp, zbin1_tmp, zbin0_tmp);
  zbins[1] = _mm_set1_epi32(zbin1_tmp);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs / 4; i++) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (!(test & 0xf)) idx_arr[idx++] = i * 4;
    if (!(test & 0xf0)) idx_arr[idx++] = i * 4 + 1;
    if (!(test & 0xf00)) idx_arr[idx++] = i * 4 + 2;
    if (!(test & 0xf000)) idx_arr[idx++] = i * 4 + 3;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = idx_arr[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 = abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], 1);
    const int64_t tmp2 = ((tmp1 * quant_ptr[rc != 0]) >> 16) + tmp1;
    const uint32_t abs_qcoeff =
        (uint32_t)((tmp2 * quant_shift_ptr[rc != 0]) >> 15);
    qcoeff_ptr[rc] = (int)(abs_qcoeff ^ (uint32_t)coeff_sign) - coeff_sign;
    dqcoeff_ptr[rc] = qcoeff_ptr[rc] * dequant_ptr[rc != 0] / 2;
    if (abs_qcoeff) eob = iscan[idx_arr[i]] > eob ? iscan[idx_arr[i]] : eob;
  }
  *eob_ptr = eob + 1;
}